

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

UnknownField * __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::elements
          (RepeatedField<google::protobuf::UnknownField> *this,bool is_soo)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  UnknownField *pUVar4;
  ThreadSafeArena *this_00;
  HeapRep *pHVar5;
  UnknownField *extraout_RAX;
  UnknownField *extraout_RAX_00;
  undefined7 in_register_00000031;
  LongSooRep *this_01;
  
  uVar2 = 0;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    uVar2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (0 < (int)uVar2) {
    if (is_soo) {
      return (UnknownField *)((long)&(this->soo_rep_).field_0 + 8);
    }
    pUVar4 = (UnknownField *)internal::LongSooRep::elements((LongSooRep *)this);
    return pUVar4;
  }
  this_01 = (LongSooRep *)(ulong)uVar2;
  elements();
  uVar1 = this_01->elements_int;
  if ((uVar1 & 4) == 0) {
    this_00 = &internal::SooRep::soo_arena((SooRep *)this_01)->impl_;
  }
  else {
    pHVar5 = heap_rep((RepeatedField<google::protobuf::UnknownField> *)this_01);
    this_00 = &((pHVar5->field_0).arena)->impl_;
  }
  if (this_00 != (ThreadSafeArena *)0x0) {
    internal::ThreadSafeArena::SpaceAllocated(this_00);
  }
  iVar3 = internal::SooRep::size((SooRep *)this_01,(uVar1 & 4) == 0);
  if (((uVar1 & 4) != 0) && (0 < iVar3)) {
    internal::LongSooRep::elements(this_01);
  }
  UnpoisonBuffer((RepeatedField<google::protobuf::UnknownField> *)this_01);
  pUVar4 = extraout_RAX;
  if ((uVar1 & 4) != 0) {
    InternalDeallocate<true>((RepeatedField<google::protobuf::UnknownField> *)this_01);
    pUVar4 = extraout_RAX_00;
  }
  return pUVar4;
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }